

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  slot_type *this;
  uint64_t uVar5;
  ulong uVar6;
  size_t sVar7;
  byte bVar8;
  uint64_t v_1;
  byte bVar9;
  size_t sVar10;
  ctrl_t cVar11;
  ulong uVar12;
  long lVar13;
  uint64_t v;
  string_view sVar14;
  FindInfo FVar15;
  HashSetResizeHelper resize_helper;
  undefined1 local_62;
  undefined1 local_61;
  void *local_60;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  sVar7 = common->capacity_;
  if (sVar7 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  bVar8 = 0x80;
  if (sVar7 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                *)0x1);
    if (1 < common->size_) {
      this = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                       *)common);
      sVar14 = google::protobuf::Symbol::full_name(this);
      uVar5 = hash_internal::MixingHashState::CombineContiguousImpl
                        (&hash_internal::MixingHashState::kSeed,sVar14._M_str,sVar14._M_len);
      bVar8 = (byte)((uVar5 ^ sVar14._M_len) * 0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar9 = 1;
      goto LAB_003ae2a6;
    }
  }
  bVar9 = 0;
LAB_003ae2a6:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar7 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_3e = bVar9;
  CommonFields::set_capacity(common,new_capacity);
  bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_61,(int)(char)bVar8,8,8);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                 );
  }
  if ((bVar9 | sVar7 != 1) == 1) {
    local_60 = (common->heap_or_soo_).heap.slot_array.p;
    slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                *)common->capacity_);
    uVar3 = local_58.heap.slot_array;
    if (!bVar4) {
      if (sVar7 == 1) {
        sVar14 = google::protobuf::Symbol::full_name((Symbol *)&local_58.heap);
        uVar5 = hash_internal::MixingHashState::CombineContiguousImpl
                          (&hash_internal::MixingHashState::kSeed,sVar14._M_str,sVar14._M_len);
        uVar12 = (uVar5 ^ sVar14._M_len) * -0x234dd359734ecb13;
        FVar15 = find_first_non_full<void>
                           (common,uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                                   (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8
                                   | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                                   (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38);
        uVar6 = FVar15.offset;
        uVar1 = common->capacity_;
        if (uVar1 <= uVar6) {
LAB_003ae4fd:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar6] = cVar11;
        pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar6 - 0xf & uVar1)] = cVar11;
        common->capacity_ = 0xffffffffffffff9c;
        *(ctrl_t **)((long)local_60 + uVar6 * 8) = local_58.heap.control;
        CommonFields::set_capacity(common,uVar1);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          lVar13 = 0;
          sVar10 = 0;
          sVar7 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar10]) {
              sVar14 = google::protobuf::Symbol::full_name((Symbol *)(lVar13 + uVar3));
              uVar5 = hash_internal::MixingHashState::CombineContiguousImpl
                                (&hash_internal::MixingHashState::kSeed,sVar14._M_str,sVar14._M_len)
              ;
              uVar12 = (uVar5 ^ sVar14._M_len) * -0x234dd359734ecb13;
              FVar15 = find_first_non_full<void>
                                 (common,uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                                         (uVar12 & 0xff0000000000) >> 0x18 |
                                         (uVar12 & 0xff00000000) >> 8 | (uVar12 & 0xff000000) << 8 |
                                         (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
                                         uVar12 << 0x38);
              uVar6 = FVar15.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar6) goto LAB_003ae4fd;
              cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar6] = cVar11;
              pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar6 - 0xf & uVar1)] = cVar11;
              common->capacity_ = 0xffffffffffffff9c;
              *(undefined8 *)((long)local_60 + uVar6 * 8) = *(undefined8 *)(uVar3 + sVar10 * 8);
              CommonFields::set_capacity(common,uVar1);
              sVar7 = local_48;
            }
            sVar10 = sVar10 + 1;
            lVar13 = lVar13 + 8;
          } while (sVar10 != sVar7);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_62,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }